

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

CapabilityPipe * __thiscall
kj::anon_unknown_30::AsyncIoProviderImpl::newCapabilityPipe
          (CapabilityPipe *__return_storage_ptr__,AsyncIoProviderImpl *this)

{
  int iVar1;
  int fds [2];
  Fault f;
  uint local_38;
  uint local_34;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  do {
    iVar1 = socketpair(1,0x80801,0,(int *)&local_38);
    if (-1 < iVar1) goto LAB_00469f50;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_30.exception = (Exception *)0x0;
    local_28 = 0;
    uStack_20 = 0;
    kj::_::Debug::Fault::init
              (&local_30,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_30);
  }
LAB_00469f50:
  (*this->lowLevel->_vptr_LowLevelAsyncIoProvider[3])
            (__return_storage_ptr__,this->lowLevel,(ulong)local_38,7);
  (*this->lowLevel->_vptr_LowLevelAsyncIoProvider[3])
            (__return_storage_ptr__->ends + 1,this->lowLevel,(ulong)local_34,7);
  return __return_storage_ptr__;
}

Assistant:

CapabilityPipe newCapabilityPipe() override {
    int fds[2];
    int type = SOCK_STREAM;
#if __linux__ && !__BIONIC__
    type |= SOCK_NONBLOCK | SOCK_CLOEXEC;
#endif
    KJ_SYSCALL(socketpair(AF_UNIX, type, 0, fds));
    return CapabilityPipe { {
      lowLevel.wrapUnixSocketFd(fds[0], NEW_FD_FLAGS),
      lowLevel.wrapUnixSocketFd(fds[1], NEW_FD_FLAGS)
    } };
  }